

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_util.cpp
# Opt level: O2

void __thiscall
TaprootUtil_CreateTapScriptControlParityBit_Test::TestBody
          (TaprootUtil_CreateTapScriptControlParityBit_Test *this)

{
  long lVar1;
  char *pcVar2;
  char *in_R9;
  TapScriptData *script_data_00;
  initializer_list<cfd::core::ByteData256> __l;
  bool is_parity;
  AssertHelper local_658;
  AssertionResult gtest_ar_4;
  SchnorrSignature sig2;
  AssertionResult gtest_ar_5;
  SchnorrSignature schnorr_sig;
  AssertHelper local_5a8;
  SigHashType sighash_type;
  Transaction tx2;
  SchnorrPubkey schnorr_pubkey;
  ByteData256 sighash2;
  Transaction tx1;
  ScriptBuilder builder;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> utxo_list;
  Pubkey pk1;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  Address addr2;
  Amount amt1;
  ByteData der_sig;
  ByteData sig;
  ByteData256 sighash;
  ByteData taproot_control;
  Pubkey pubkey;
  SigHashType local_278;
  SigHashType local_26c;
  TapScriptData script_data;
  Privkey key;
  TaprootScriptTree tree;
  Privkey key1;
  Script locking_script;
  Script redeem_script;
  Script pkh_script1;
  ScriptWitness local_c8;
  ScriptWitness local_a8;
  ScriptWitness local_88;
  ScriptWitness local_68;
  ScriptWitness local_48;
  
  std::__cxx11::string::string
            ((string *)&addr2,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
             (allocator *)&tree);
  cfd::core::Privkey::Privkey(&key,(string *)&addr2,kMainnet,true);
  std::__cxx11::string::~string((string *)&addr2);
  cfd::core::Privkey::GeneratePubkey(&pubkey,&key,true);
  is_parity = false;
  cfd::core::SchnorrPubkey::FromPubkey(&schnorr_pubkey,&pubkey,&is_parity);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&addr2,&schnorr_pubkey);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&tree,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             "schnorr_pubkey.GetHex()",(char (*) [65])0x44c698,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2);
  std::__cxx11::string::~string((string *)&addr2);
  if ((char)tree.super_TapBranch._vptr_TapBranch == '\0') {
    testing::Message::Message((Message *)&addr2);
    if (tree.super_TapBranch._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)tree.super_TapBranch._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sig2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sig2,(Message *)&addr2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sig2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tree.super_TapBranch.has_leaf_);
  tree.super_TapBranch._vptr_TapBranch._0_1_ = is_parity;
  tree.super_TapBranch.has_leaf_ = false;
  tree.super_TapBranch.leaf_version_ = '\0';
  tree.super_TapBranch._10_6_ = 0;
  if (is_parity == false) {
    testing::Message::Message((Message *)&sig2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&addr2,(internal *)&tree,(AssertionResult *)"is_parity","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x80,(char *)addr2._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx1,(Message *)&sig2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx1);
    std::__cxx11::string::~string((string *)&addr2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tree.super_TapBranch.has_leaf_);
  builder._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_005ba258;
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::SchnorrPubkey::GetData((ByteData *)&addr2,&schnorr_pubkey);
  cfd::core::ScriptBuilder::AppendData(&builder,(ByteData *)&addr2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr2);
  cfd::core::ScriptBuilder::AppendOperator
            (&builder,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build(&redeem_script,&builder);
  std::__cxx11::string::string
            ((string *)&tree,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)&tx1);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&addr2,(string *)&tree);
  std::__cxx11::string::string
            ((string *)&sig2,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57",
             (allocator *)&tx2);
  cfd::core::ByteData256::ByteData256
            ((ByteData256 *)&addr2.address_._M_string_length,(string *)&sig2);
  __l._M_len = 2;
  __l._M_array = (iterator)&addr2;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            (&nodes,__l,(allocator_type *)&locking_script);
  lVar1 = 0x18;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&addr2.type_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  std::__cxx11::string::~string((string *)&sig2);
  std::__cxx11::string::~string((string *)&tree);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree,&redeem_script);
  cfd::core::TaprootScriptTree::AddBranch
            (&tree,nodes.
                   super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  cfd::core::SchnorrPubkey::SchnorrPubkey
            ((SchnorrPubkey *)&addr2,
             nodes.
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
             _M_impl.super__Vector_impl_data._M_start + 1);
  cfd::core::TapBranch::AddBranch(&tree.super_TapBranch,(SchnorrPubkey *)&addr2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr2);
  cfd::core::Script::Script(&locking_script);
  cfd::core::TaprootUtil::CreateTapScriptControl
            (&taproot_control,&schnorr_pubkey,&tree.super_TapBranch,(SchnorrPubkey *)0x0,
             &locking_script);
  cfd::core::Transaction::Transaction(&tx1,2,0);
  std::__cxx11::string::string
            ((string *)&sig2,"fee03a31ddbe8f8af75f9ccea23d2d49c27538b1c183aa90c4e35529161a78df",
             (allocator *)&tx2);
  cfd::core::Txid::Txid((Txid *)&addr2,(string *)&sig2);
  cfd::core::Transaction::AddTxIn
            (&tx1,(Txid *)&addr2,0,0xffffffff,(Script *)cfd::core::Script::Empty);
  cfd::core::Txid::~Txid((Txid *)&addr2);
  std::__cxx11::string::~string((string *)&sig2);
  cfd::core::Amount::Amount(&amt1,0x9502f518);
  cfd::core::Transaction::AddTxOut(&tx1,&amt1,&locking_script);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)&addr2,&tx1.super_AbstractTransaction)
  ;
  testing::internal::CmpHelperEQ<char[189],std::__cxx11::string>
            ((internal *)&sig2,
             "\"0200000001df781a162955e3c490aa83c1b13875c2492d3da2ce9c5ff78a8fbedd313ae0fe0000000000ffffffff0118f5029500000000225120262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad4016500000000\""
             ,"tx1.GetHex()",
             (char (*) [189])
             "0200000001df781a162955e3c490aa83c1b13875c2492d3da2ce9c5ff78a8fbedd313ae0fe0000000000ffffffff0118f5029500000000225120262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad4016500000000"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2);
  std::__cxx11::string::~string((string *)&addr2);
  if ((char)sig2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&addr2);
    if (sig2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)sig2.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x9a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx2,(Message *)&addr2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&sig2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::string
            ((string *)&addr2,"cNveTchXQTFjtsMmR7B7MZmebXnU69S7PmDfgrUX6KbT9kyDLH57",
             (allocator *)&sig2);
  cfd::core::Privkey::FromWif(&key1,(string *)&addr2,kCustomChain,true);
  std::__cxx11::string::~string((string *)&addr2);
  std::__cxx11::string::string
            ((string *)&addr2,"023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44",
             (allocator *)&sig2);
  cfd::core::Pubkey::Pubkey(&pk1,(string *)&addr2);
  std::__cxx11::string::~string((string *)&addr2);
  cfd::core::ScriptUtil::CreateP2pkhLockingScript(&pkh_script1,&pk1);
  cfd::core::SigHashType::SigHashType(&sighash_type);
  cfd::core::Script::GetData((ByteData *)&addr2,&pkh_script1);
  cfd::core::SigHashType::SigHashType(&local_26c,&sighash_type);
  cfd::core::Amount::Amount((Amount *)&sig2,2500000000);
  cfd::core::Transaction::GetSignatureHash
            (&sighash,&tx1,0,(ByteData *)&addr2,&local_26c,(Amount *)&sig2,kVersion0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr2);
  cfd::core::Privkey::CalculateEcSignature(&sig,&key1,&sighash,true);
  cfd::core::CryptoUtil::ConvertSignatureToDer(&der_sig,&sig,&sighash_type);
  cfd::core::Transaction::AddScriptWitnessStack(&local_48,&tx1,0,&der_sig);
  cfd::core::ScriptWitness::~ScriptWitness(&local_48);
  cfd::core::Pubkey::GetData((ByteData *)&addr2,&pk1);
  cfd::core::Transaction::AddScriptWitnessStack(&local_68,&tx1,0,(ByteData *)&addr2);
  cfd::core::ScriptWitness::~ScriptWitness(&local_68);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr2);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)&addr2,&tx1.super_AbstractTransaction)
  ;
  testing::internal::CmpHelperEQ<char[407],std::__cxx11::string>
            ((internal *)&sig2,
             "\"02000000000101df781a162955e3c490aa83c1b13875c2492d3da2ce9c5ff78a8fbedd313ae0fe0000000000ffffffff0118f5029500000000225120262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad4016502473044022068e673ac6db21d612864f432c5cfb64f3652e37be27de412c62dd6127ad63ce1022028507107481ad4fe97da3402eeff0540b0cc1677f9a53e87a7facf07c2696e500121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000\""
             ,"tx1.GetHex()",
             (char (*) [407])
             "02000000000101df781a162955e3c490aa83c1b13875c2492d3da2ce9c5ff78a8fbedd313ae0fe0000000000ffffffff0118f5029500000000225120262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad4016502473044022068e673ac6db21d612864f432c5cfb64f3652e37be27de412c62dd6127ad63ce1022028507107481ad4fe97da3402eeff0540b0cc1677f9a53e87a7facf07c2696e500121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2);
  std::__cxx11::string::~string((string *)&addr2);
  if ((char)sig2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&addr2);
    if (sig2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)sig2.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0xa5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx2,(Message *)&addr2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&sig2.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  cfd::core::Transaction::Transaction(&tx2,2,0);
  cfd::core::AbstractTransaction::GetTxid((Txid *)&addr2,&tx1.super_AbstractTransaction);
  cfd::core::Transaction::AddTxIn
            (&tx2,(Txid *)&addr2,0,0xffffffff,(Script *)cfd::core::Script::Empty);
  cfd::core::Txid::~Txid((Txid *)&addr2);
  std::__cxx11::string::string
            ((string *)&sig2,"bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40",
             (allocator *)&schnorr_sig);
  cfd::core::Address::Address(&addr2,(string *)&sig2);
  std::__cxx11::string::~string((string *)&sig2);
  cfd::core::Amount::Amount((Amount *)&schnorr_sig,0x9502f130);
  cfd::core::Address::GetLockingScript((Script *)&sig2,&addr2);
  cfd::core::Transaction::AddTxOut(&tx2,(Amount *)&schnorr_sig,(Script *)&sig2);
  cfd::core::Script::~Script((Script *)&sig2);
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::vector
            (&utxo_list,1,(allocator_type *)&sig2);
  cfd::core::TxOut::TxOut((TxOut *)&sig2,&amt1,&locking_script);
  cfd::core::AbstractTxOut::operator=
            (&(utxo_list.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOut,(AbstractTxOut *)&sig2
            );
  cfd::core::AbstractTxOut::~AbstractTxOut((AbstractTxOut *)&sig2);
  cfd::core::TapScriptData::TapScriptData(&script_data);
  cfd::core::TaprootScriptTree::GetTapLeafHash((ByteData256 *)&sig2,&tree);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&script_data,&sig2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig2);
  cfd::core::SigHashType::SigHashType(&local_278,&sighash_type);
  cfd::core::ByteData::ByteData(&sig2.data_);
  script_data_00 = &script_data;
  cfd::core::Transaction::GetSchnorrSignatureHash
            (&sighash2,&tx2,0,&local_278,&utxo_list,script_data_00,&sig2.data_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig2);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&sig2,&sighash2);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&schnorr_sig,
             "\"194c654c0547d805c158711fcf96ed9bc4afbd48556a0632cd2b18ec94c3f773\"",
             "sighash2.GetHex()",
             (char (*) [65])"194c654c0547d805c158711fcf96ed9bc4afbd48556a0632cd2b18ec94c3f773",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sig2);
  std::__cxx11::string::~string((string *)&sig2);
  if ((char)schnorr_sig.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&sig2);
    if (schnorr_sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)schnorr_sig.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&sig2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sig2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&schnorr_sig.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  cfd::core::SchnorrUtil::Sign(&sig2,&sighash2,&key);
  cfd::core::SchnorrSignature::GetHex_abi_cxx11_((string *)&schnorr_sig,&sig2,false);
  testing::internal::CmpHelperEQ<char[129],std::__cxx11::string>
            ((internal *)&gtest_ar_4,
             "\"bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e0\""
             ,"sig2.GetHex()",
             (char (*) [129])
             "bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e0"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&schnorr_sig);
  std::__cxx11::string::~string((string *)&schnorr_sig);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&schnorr_sig);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5,(Message *)&schnorr_sig);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&schnorr_sig);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  cfd::core::SchnorrSignature::SchnorrSignature(&schnorr_sig,&sig2);
  cfd::core::SchnorrSignature::SetSigHashType(&schnorr_sig,&sighash_type);
  cfd::core::SchnorrSignature::GetData((ByteData *)&gtest_ar_4,&schnorr_sig,true);
  cfd::core::Transaction::AddScriptWitnessStack(&local_88,&tx2,0,(ByteData *)&gtest_ar_4);
  cfd::core::ScriptWitness::~ScriptWitness(&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_4);
  cfd::core::Script::GetData((ByteData *)&gtest_ar_4,&redeem_script);
  cfd::core::Transaction::AddScriptWitnessStack(&local_a8,&tx2,0,(ByteData *)&gtest_ar_4);
  cfd::core::ScriptWitness::~ScriptWitness(&local_a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_4);
  cfd::core::Transaction::AddScriptWitnessStack(&local_c8,&tx2,0,&taproot_control);
  cfd::core::ScriptWitness::~ScriptWitness(&local_c8);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&gtest_ar_4,&tx2.super_AbstractTransaction);
  testing::internal::CmpHelperEQ<char[569],std::__cxx11::string>
            ((internal *)&gtest_ar_5,
             "\"020000000001010513391eb3cb6529b86485dbee924a070a7e556c084ed6f0ff338d7a80335c450000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5700000000\""
             ,"tx2.GetHex()",
             (char (*) [569])
             "020000000001010513391eb3cb6529b86485dbee924a070a7e556c084ed6f0ff338d7a80335c450000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5700000000"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_4);
  std::__cxx11::string::~string((string *)&gtest_ar_4);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (gtest_ar_5.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_5.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0xb8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_658,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_658);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  gtest_ar_5.success_ = cfd::core::SchnorrPubkey::Verify(&schnorr_pubkey,&schnorr_sig,&sighash2);
  gtest_ar_5.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar_5.success_) {
    testing::Message::Message((Message *)&local_658);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4,(internal *)&gtest_ar_5,
               (AssertionResult *)"schnorr_pubkey.Verify(schnorr_sig, sighash2)","false","true",
               (char *)script_data_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0xba,(char *)CONCAT71(gtest_ar_4._1_7_,gtest_ar_4.success_));
    testing::internal::AssertHelper::operator=(&local_5a8,(Message *)&local_658);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    std::__cxx11::string::~string((string *)&gtest_ar_4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_658);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_5.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script_data);
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::~vector(&utxo_list);
  cfd::core::Address::~Address(&addr2);
  cfd::core::Transaction::~Transaction(&tx2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&der_sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash);
  cfd::core::Script::~Script(&pkh_script1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pk1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key1);
  cfd::core::Transaction::~Transaction(&tx1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&taproot_control);
  cfd::core::Script::~Script(&locking_script);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&nodes);
  cfd::core::Script::~Script(&redeem_script);
  cfd::core::ScriptBuilder::~ScriptBuilder(&builder);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  return;
}

Assistant:

TEST(TaprootUtil, CreateTapScriptControlParityBit) {
  Privkey key("305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  ScriptBuilder builder;
  builder.AppendData(schnorr_pubkey.GetData());
  builder.AppendOperator(ScriptOperator::OP_CHECKSIG);
  Script redeem_script = builder.Build();
  std::vector<ByteData256> nodes = {
    ByteData256("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"),
    ByteData256("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57")
  };
  TaprootScriptTree tree(redeem_script);
  tree.AddBranch(nodes[0]);
  tree.AddBranch(SchnorrPubkey(nodes[1]));
  // auto pk = tree.GetTweakedPubkey(schnorr_pubkey);
  // Script locking_script = ScriptUtil::CreateTaprootLockingScript(
  //   pk.GetByteData256());
  Script locking_script;
  auto taproot_control = TaprootUtil::CreateTapScriptControl(
      schnorr_pubkey, tree, nullptr, &locking_script);

  Transaction tx1(2, 0);
  tx1.AddTxIn(
      Txid("fee03a31ddbe8f8af75f9ccea23d2d49c27538b1c183aa90c4e35529161a78df"),
      0, 0xffffffff);  // bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40
  Amount amt1(int64_t{2499999000});
  tx1.AddTxOut(amt1, locking_script);
  EXPECT_EQ("0200000001df781a162955e3c490aa83c1b13875c2492d3da2ce9c5ff78a8fbedd313ae0fe0000000000ffffffff0118f5029500000000225120262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad4016500000000", tx1.GetHex());
  Privkey key1 = Privkey::FromWif("cNveTchXQTFjtsMmR7B7MZmebXnU69S7PmDfgrUX6KbT9kyDLH57");
  Pubkey pk1("023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44");
  auto pkh_script1 = ScriptUtil::CreateP2pkhLockingScript(pk1);
  SigHashType sighash_type;
  auto sighash = tx1.GetSignatureHash(0, pkh_script1.GetData(),
        sighash_type, Amount(int64_t{2500000000}), WitnessVersion::kVersion0);
  auto sig = key1.CalculateEcSignature(sighash);
  auto der_sig = CryptoUtil::ConvertSignatureToDer(sig, sighash_type);
  tx1.AddScriptWitnessStack(0, der_sig);
  tx1.AddScriptWitnessStack(0, pk1.GetData());
  EXPECT_EQ("02000000000101df781a162955e3c490aa83c1b13875c2492d3da2ce9c5ff78a8fbedd313ae0fe0000000000ffffffff0118f5029500000000225120262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad4016502473044022068e673ac6db21d612864f432c5cfb64f3652e37be27de412c62dd6127ad63ce1022028507107481ad4fe97da3402eeff0540b0cc1677f9a53e87a7facf07c2696e500121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000", tx1.GetHex());
  
  Transaction tx2(2, 0);
  tx2.AddTxIn(tx1.GetTxid(), 0, 0xffffffff);  // taproot
  Address addr2("bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40");
  tx2.AddTxOut(Amount(int64_t{2499998000}), addr2.GetLockingScript());
  std::vector<TxOut> utxo_list(1);
  utxo_list[0] = TxOut(amt1, locking_script);
  TapScriptData script_data;
  script_data.tap_leaf_hash = tree.GetTapLeafHash();
  auto sighash2 = tx2.GetSchnorrSignatureHash(0, sighash_type, utxo_list, &script_data);
  EXPECT_EQ("194c654c0547d805c158711fcf96ed9bc4afbd48556a0632cd2b18ec94c3f773", sighash2.GetHex());
  auto sig2 = SchnorrUtil::Sign(sighash2, key);
  EXPECT_EQ("bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e0", sig2.GetHex());
  SchnorrSignature schnorr_sig(sig2);
  schnorr_sig.SetSigHashType(sighash_type);
  tx2.AddScriptWitnessStack(0, schnorr_sig.GetData(true));
  tx2.AddScriptWitnessStack(0, redeem_script.GetData());
  tx2.AddScriptWitnessStack(0, taproot_control);
  EXPECT_EQ("020000000001010513391eb3cb6529b86485dbee924a070a7e556c084ed6f0ff338d7a80335c450000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5700000000", tx2.GetHex());

  EXPECT_TRUE(schnorr_pubkey.Verify(schnorr_sig, sighash2));
}